

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

void lddmc_gc_mark_protected_CALL(WorkerP *w,Task *__dq_head)

{
  MDD *pMVar1;
  Task *__dq_head_local;
  WorkerP *w_local;
  MDD *to_mark;
  uint64_t *it;
  size_t count;
  WorkerP *local_10;
  
  it = (uint64_t *)0x0;
  count = (size_t)__dq_head;
  local_10 = w;
  to_mark = protect_iter(&lddmc_protected,0,lddmc_protected.refs_size);
  while (to_mark != (MDD *)0x0) {
    pMVar1 = (MDD *)protect_next(&lddmc_protected,&to_mark,lddmc_protected.refs_size);
    lddmc_gc_mark_rec_SPAWN(local_10,(Task *)count,*pMVar1);
    count = count + 0x40;
    it = (uint64_t *)((long)it + 1);
  }
  while (it != (uint64_t *)0x0) {
    count = count - 0x40;
    it = (uint64_t *)((long)it + -1);
    lddmc_gc_mark_rec_SYNC(local_10,(Task *)count);
  }
  return;
}

Assistant:

VOID_TASK_0(lddmc_gc_mark_protected)
{
    // iterate through refs hash table, mark all found
    size_t count=0;
    uint64_t *it = protect_iter(&lddmc_protected, 0, lddmc_protected.refs_size);
    while (it != NULL) {
        MDD *to_mark = (MDD*)protect_next(&lddmc_protected, &it, lddmc_protected.refs_size);
        SPAWN(lddmc_gc_mark_rec, *to_mark);
        count++;
    }
    while (count--) {
        SYNC(lddmc_gc_mark_rec);
    }
}